

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O1

float GD::sensitivity<true,false,true,0ul,1ul,2ul>(gd *g,base_learner *param_2,example *ec)

{
  float fVar1;
  shared_data *psVar2;
  float fVar3;
  float fVar4;
  
  psVar2 = g->all->sd;
  fVar1 = g->all->eta;
  fVar3 = powf((float)((psVar2->t + 1.0) - psVar2->weighted_holdout_examples),g->neg_power_t);
  fVar4 = get_pred_per_update<true,false,true,0ul,1ul,2ul,true>(g,ec);
  return fVar4 * fVar3 * fVar1;
}

Assistant:

float sensitivity(gd& g, base_learner& /* base */, example& ec)
{
  return get_scale<adaptive>(g, ec, 1.) *
      sensitivity<sqrt_rate, feature_mask_off, adax, adaptive, normalized, spare, true>(g, ec);
}